

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
insert<kj::HashMap<kj::String,int>::Entry,kj::String&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t pos,String *params)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  uint *puVar7;
  HashBucket *s;
  uint *puVar8;
  HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *this_00;
  ulong targetSize;
  String *in_R9;
  long lVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = (HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *)table.ptr;
  uVar2 = *(long *)(this_00 + 0x18) * 2;
  if (uVar2 < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar2) {
      targetSize = uVar2;
    }
    HashIndex<kj::HashMap<kj::String,_int>::Callbacks>::rehash(this_00,targetSize);
  }
  uVar4 = hashCode<kj::String&>(in_R9);
  uVar5 = _::chooseBucket((uint)(uVar4 != 0),*(uint *)(this_00 + 0x18));
  puVar8 = (uint *)0x0;
  aVar6 = extraout_RDX;
  do {
    puVar7 = (uint *)(*(long *)(this_00 + 0x10) + (ulong)uVar5 * 8);
    uVar1 = puVar7[1];
    if (uVar1 == 1) {
      if (puVar8 == (uint *)0x0) {
        puVar8 = puVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (puVar8 != (uint *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          puVar7 = puVar8;
        }
        *(ulong *)puVar7 = ((ulong)(uVar4 != 0) | (long)params << 0x20) + 0x200000000;
        *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
        goto LAB_00163df6;
      }
      if (*puVar7 == (uint)(uVar4 != 0)) {
        bVar3 = HashMap<kj::String,int>::Callbacks::matches<kj::String&>
                          ((Callbacks *)this_00,
                           (StringPtr *)((ulong)(uVar1 - 2) * 0x20 + table.size_),in_R9);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          uVar5 = puVar7[1];
          *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar5 - 2);
LAB_00163df6:
          MVar10.ptr.field_1.value = aVar6.value;
          MVar10.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar10.ptr;
        }
      }
    }
    lVar9 = (ulong)uVar5 + 1;
    uVar5 = 0;
    if (lVar9 != *(long *)(this_00 + 0x18)) {
      uVar5 = (uint)lVar9;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }